

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

size_t bakeBSTS_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t ec_deep_00;
  size_t sVar4;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  sVar1 = bakeBSTSStart_deep(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sVar2 = bakeBSTSStep2_deep(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,sVar1,
                             in_stack_ffffffffffffffb8);
  sVar3 = bakeBSTSStep3_deep(ec_deep,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  ec_deep_00 = bakeBSTSStep4_deep(ec_d,ec_deep,in_stack_00000020,in_stack_00000018);
  sVar4 = bakeBSTSStep5_deep(in_RSI,in_RDX,in_RCX,ec_deep_00);
  sVar1 = utilMax(5,sVar1,sVar2,sVar3,ec_deep_00,sVar4);
  return sVar1;
}

Assistant:

static size_t bakeBSTS_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return utilMax(5,
		bakeBSTSStart_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep2_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep3_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep4_deep(n, f_deep, ec_d, ec_deep),
		bakeBSTSStep5_deep(n, f_deep, ec_d, ec_deep));
}